

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

int __thiscall
CVmObjStringBuffer::getp_splice
          (CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  int iVar2;
  vm_strbuf_ext *pvVar3;
  char *pcVar4;
  vm_val_t *pvVar5;
  int32_t ins_bytes;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjStringBuffer *in_RDI;
  char *str;
  vm_val_t strval;
  int32_t del;
  int32_t idx;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff98;
  int32_t iVar6;
  int32_t del_chars;
  CVmObjStringBuffer *in_stack_ffffffffffffffb0;
  anon_union_8_8_cb74652f_for_val local_48;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffcc;
  
  if ((getp_splice(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_splice(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_splice::desc,3);
    __cxa_guard_release(&getp_splice(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (uint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (iVar1 == 0) {
    iVar1 = CVmBif::pop_int_val();
    if (iVar1 < 0) {
      pvVar3 = get_ext(in_RDI);
      iVar6 = pvVar3->len;
    }
    else {
      iVar6 = -1;
    }
    del_chars = (int32_t)((ulong)in_RDI >> 0x20);
    iVar1 = iVar6 + iVar1;
    iVar2 = CVmBif::pop_int_val();
    CVmStack::get(0);
    pcVar4 = vm_val_t::cast_to_string
                       ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffcc,iVar1),
                        (vm_val_t *)CONCAT44(iVar2,in_stack_ffffffffffffffc0));
    pvVar5 = CVmStack::get(0);
    *(CVmObjStringBuffer **)pvVar5 = in_stack_ffffffffffffffb0;
    pvVar5->val = local_48;
    ins_bytes = (int32_t)((ulong)(pcVar4 + 2) >> 0x20);
    vmb_get_len((char *)0x335cee);
    splice_text(in_stack_ffffffffffffffb0,(vm_obj_id_t)((ulong)pcVar4 >> 0x20),(int32_t)pcVar4,
                del_chars,(char *)CONCAT44(iVar6,in_stack_ffffffffffffff98),ins_bytes,
                in_stack_ffffffffffffffc0);
    CVmStack::discard();
    vm_val_t::set_obj(in_RDX,in_ESI);
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_splice(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(3);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the insertion index and adjust to 0-based or end-based */
    int32_t idx = CVmBif::pop_int_val(vmg0_);
    idx += (idx < 0 ? get_ext()->len : -1);

    /* pop the deletion length */
    int32_t del = CVmBif::pop_int_val(vmg0_);

    /* get or cast the string; leave it on the stack for gc protection */
    vm_val_t strval;
    const char *str = G_stk->get(0)->cast_to_string(vmg_ &strval);
    *G_stk->get(0) = strval;

    /* do the insert */
    splice_text(vmg_ self, idx, del, str + VMB_LEN, vmb_get_len(str), TRUE);

    /* discard gc protection */
    G_stk->discard();

    /* handled */
    retval->set_obj(self);
    return TRUE;
}